

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall verona::Options::configure(Options *this,App *cli)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  App *local_18;
  App *cli_local;
  Options *this_local;
  
  local_18 = cli;
  cli_local = (App *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"--no-std",&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Don\'t import the standard library.",&local_71);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(cli,&local_38,&this->no_std,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator(&local_71);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void Options::configure(CLI::App& cli)
  {
    cli.add_flag("--no-std", no_std, "Don't import the standard library.");
  }